

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mipmap.cpp
# Opt level: O0

float __thiscall pbrt::MIPMap::Lookup<float>(MIPMap *this,Point2f *st,Vector2f dst0,Vector2f dst1)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  initializer_list<float> __l;
  Point2f st_00;
  int iVar3;
  float *pfVar4;
  undefined8 *in_RSI;
  long in_RDI;
  Tuple2<pbrt::Vector2,_float> *pTVar5;
  float fVar6;
  type tVar7;
  type tVar8;
  Float FVar9;
  float fVar10;
  float fVar11;
  double dVar12;
  undefined1 in_ZMM0 [64];
  undefined1 in_ZMM1 [64];
  float unaff_retaddr;
  int in_stack_0000000c;
  MIPMap *in_stack_00000010;
  Vector2f in_stack_0000001c;
  Vector2f in_stack_00000024;
  Tuple2<pbrt::Point2,_float> in_stack_0000002c;
  int ilod;
  Float lod;
  Float scale;
  Float minorLength;
  Float majorLength;
  Float width;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff40;
  float fVar13;
  undefined4 in_stack_ffffffffffffff44;
  float local_74;
  float local_70;
  float local_6c;
  undefined8 local_68;
  float local_5c;
  float local_58;
  float local_54;
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  float *local_40;
  undefined8 local_38;
  float local_2c;
  undefined8 *local_28;
  undefined4 in_stack_ffffffffffffffe8;
  float in_stack_fffffffffffffffc;
  
  uVar1 = vmovlpd_avx(in_ZMM0._0_16_);
  fVar10 = (float)uVar1;
  uVar1 = vmovlpd_avx(in_ZMM1._0_16_);
  fVar6 = (float)uVar1;
  fVar13 = (float)((ulong)uVar1 >> 0x20);
  if (*(int *)(in_RDI + 0x2c) == 3) {
    local_28 = in_RSI;
    tVar7 = LengthSquared<float>
                      ((Vector2<float> *)
                       CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    tVar8 = LengthSquared<float>
                      ((Vector2<float> *)
                       CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    if (tVar7 < tVar8) {
      pstd::swap<pbrt::Vector2<float>>
                ((Vector2<float> *)&stack0xfffffffffffffff4,
                 (Vector2<float> *)&stack0xffffffffffffffec);
    }
    local_54 = Length<float>((Vector2<float> *)0x8d712a);
    local_58 = Length<float>((Vector2<float> *)0x8d713d);
    if ((local_58 * *(float *)(in_RDI + 0x30) < local_54) && (0.0 < local_58)) {
      local_5c = local_54 / (local_58 * *(float *)(in_RDI + 0x30));
      Tuple2<pbrt::Vector2,float>::operator*=
                ((Tuple2<pbrt::Vector2,float> *)&stack0xffffffffffffffec,local_5c);
      local_58 = local_5c * local_58;
    }
    if ((local_58 != 0.0) || (NAN(local_58))) {
      local_70 = 0.0;
      iVar3 = Levels((MIPMap *)0x8d720a);
      fVar6 = (float)(iVar3 + -1);
      FVar9 = Log2(0.0);
      local_74 = fVar6 + FVar9;
      pfVar4 = std::max<float>(&local_70,&local_74);
      local_6c = *pfVar4;
      dVar12 = std::floor((double)(ulong)(uint)local_6c);
      fVar6 = 1.0 - (local_6c - (float)(int)SUB84(dVar12,0));
      fVar10 = EWA<float>(in_stack_00000010,in_stack_0000000c,(Point2f)in_stack_0000002c,
                          in_stack_00000024,in_stack_0000001c);
      fVar13 = local_6c - (float)(int)SUB84(dVar12,0);
      fVar11 = EWA<float>(in_stack_00000010,in_stack_0000000c,(Point2f)in_stack_0000002c,
                          in_stack_00000024,in_stack_0000001c);
      auVar2 = vfmadd213ss_fma(ZEXT416((uint)fVar10),ZEXT416((uint)fVar6),
                               ZEXT416((uint)(fVar13 * fVar11)));
      fVar6 = auVar2._0_4_;
    }
    else {
      local_68 = *local_28;
      st_00.super_Tuple2<pbrt::Point2,_float>.y = unaff_retaddr;
      st_00.super_Tuple2<pbrt::Point2,_float>.x = in_stack_fffffffffffffffc;
      fVar6 = Bilerp<float>((MIPMap *)CONCAT44(fVar10,fVar13),(int)fVar6,st_00);
    }
  }
  else {
    pTVar5 = (Tuple2<pbrt::Vector2,_float> *)&stack0xfffffffffffffff4;
    pfVar4 = Tuple2<pbrt::Vector2,_float>::operator[](pTVar5,0);
    FVar9 = (Float)((ulong)in_RDI >> 0x20);
    fVar11 = *pfVar4;
    std::abs((int)pTVar5);
    pTVar5 = (Tuple2<pbrt::Vector2,_float> *)&stack0xfffffffffffffff4;
    local_50 = fVar11;
    pfVar4 = Tuple2<pbrt::Vector2,_float>::operator[](pTVar5,1);
    fVar11 = *pfVar4;
    std::abs((int)pTVar5);
    pTVar5 = (Tuple2<pbrt::Vector2,_float> *)&stack0xffffffffffffffec;
    local_4c = fVar11;
    pfVar4 = Tuple2<pbrt::Vector2,_float>::operator[](pTVar5,0);
    fVar11 = *pfVar4;
    std::abs((int)pTVar5);
    pTVar5 = (Tuple2<pbrt::Vector2,_float> *)&stack0xffffffffffffffec;
    local_48 = fVar11;
    pfVar4 = Tuple2<pbrt::Vector2,_float>::operator[](pTVar5,1);
    fVar11 = *pfVar4;
    std::abs((int)pTVar5);
    local_40 = &local_50;
    local_38 = 4;
    __l._M_array._4_4_ = in_stack_ffffffffffffff3c;
    __l._M_array._0_4_ = in_stack_ffffffffffffff38;
    __l._M_len._0_4_ = in_stack_ffffffffffffff40;
    __l._M_len._4_4_ = in_stack_ffffffffffffff44;
    local_44 = fVar11;
    local_2c = std::max<float>(__l);
    fVar6 = Lookup<float>((MIPMap *)CONCAT44(fVar10,fVar13),
                          (Point2f *)CONCAT44(fVar6,in_stack_ffffffffffffffe8),FVar9);
  }
  return fVar6;
}

Assistant:

T MIPMap::Lookup(const Point2f &st, Vector2f dst0, Vector2f dst1) const {
    if (options.filter != FilterFunction::EWA) {
        Float width = std::max(
            {std::abs(dst0[0]), std::abs(dst0[1]), std::abs(dst1[0]), std::abs(dst1[1])});
        return Lookup<T>(st, 2 * width);
    }
    // Compute ellipse minor and major axes
    if (LengthSquared(dst0) < LengthSquared(dst1))
        pstd::swap(dst0, dst1);
    Float majorLength = Length(dst0);
    Float minorLength = Length(dst1);

    // Clamp ellipse eccentricity if too large
    if (minorLength * options.maxAnisotropy < majorLength && minorLength > 0) {
        Float scale = majorLength / (minorLength * options.maxAnisotropy);
        dst1 *= scale;
        minorLength *= scale;
    }
    if (minorLength == 0)
        return Bilerp<T>(0, st);

    // Choose level of detail for EWA lookup and perform EWA filtering
    Float lod = std::max<Float>(0, Levels() - 1 + Log2(minorLength));
    int ilod = std::floor(lod);
    // TODO: just do return EWA<T>(ilog, st, dst0, dst1);
    // TODO: also, when scaling camera ray differentials, just do e.g.
    // 1 / std::min(sqrtSamplesPerPixel, 8);
    return ((1 - (lod - ilod)) * EWA<T>(ilod, st, dst0, dst1) +
            (lod - ilod) * EWA<T>(ilod + 1, st, dst0, dst1));
}